

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O1

err_t bakeBPACEStart(void *state,bign_params *params,bake_settings *settings,octet *pwd,
                    size_t pwd_len)

{
  long lVar1;
  long *plVar2;
  bool_t bVar3;
  err_t eVar4;
  long lVar5;
  long lVar6;
  
  bVar3 = memIsValid(params,0x150);
  eVar4 = 0x6d;
  if ((bVar3 != 0) && (bVar3 = memIsValid(settings,0x38), bVar3 != 0)) {
    if ((settings->helloa != (void *)0x0) &&
       (bVar3 = memIsValid(settings->helloa,settings->helloa_len), bVar3 == 0)) {
      return 0x6d;
    }
    if ((settings->hellob != (void *)0x0) &&
       (bVar3 = memIsValid(settings->hellob,settings->hellob_len), bVar3 == 0)) {
      return 0x6d;
    }
    bVar3 = memIsValid(pwd,pwd_len);
    if (bVar3 != 0) {
      bVar3 = bignIsOperable(params);
      if (bVar3 == 0) {
        eVar4 = 0x1f6;
      }
      else if (settings->rng == (gen_i)0x0) {
        eVar4 = 0x130;
      }
      else {
        eVar4 = bignStart((void *)((long)state + 0xd0),params);
        if (eVar4 == 0) {
          *(void **)((long)state + 0x18) = (void *)((long)state + 0xd0);
          lVar1 = *(long *)(*(long *)((long)state + 0xe8) + 0x30);
          lVar6 = *(long *)(*(long *)((long)state + 0xe8) + 0x38);
          memCopy((void *)((long)state + 0x38),settings,0x38);
          plVar2 = *(long **)((long)state + 0x18);
          lVar5 = *plVar2;
          *(long *)((long)state + 0x20) = lVar5 + (long)plVar2;
          lVar5 = lVar5 + (long)plVar2 + lVar6;
          *(long *)((long)state + 0x28) = lVar5;
          *(long *)((long)state + 0x30) = lVar1 * 0x10 + lVar5;
          lVar5 = *plVar2;
          lVar6 = lVar1 * 0x18 + lVar6;
          *(long *)state = lVar5 + 0xd0 + lVar6;
          *(undefined8 *)((long)state + 8) = 4;
          *(undefined8 *)((long)state + 0x10) = 1;
          beltHashStart((void *)((long)state + lVar6 + lVar5 + 0xd0));
          beltHashStepH(pwd,pwd_len,(void *)(*state + (long)state));
          beltHashStepG((octet *)((long)state + 0xb0),(void *)((long)state + *state));
          eVar4 = 0;
        }
      }
    }
  }
  return eVar4;
}

Assistant:

err_t bakeBPACEStart(void* state, const bign_params* params,
	const bake_settings* settings, const octet pwd[], size_t pwd_len)
{
	err_t code;
	bake_bpace_o* s = (bake_bpace_o*)state;
	size_t n, no;
	// проверить входные данные
	if (!memIsValid(params, sizeof(bign_params)) ||
		!memIsValid(settings, sizeof(bake_settings)) ||
		!memIsNullOrValid(settings->helloa, settings->helloa_len) ||
		!memIsNullOrValid(settings->hellob, settings->hellob_len) ||
		!memIsValid(pwd, pwd_len))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	if (settings->rng == 0)
		return ERR_BAD_RNG;
	// загрузить параметры
	code = bignStart(s->data, params);
	ERR_CALL_CHECK(code);
	s->ec = (ec_o*)s->data;
	n = s->ec->f->n, no = s->ec->f->no;
	// загрузить настройки
	memCopy(s->settings, settings, sizeof(bake_settings));
	// настроить указатели
	s->R = objEnd(s->ec, octet);
	s->W = (word*)(s->R + no);
	s->u = s->W + 2 * n;
	// настроить заголовок
	s->hdr.keep = sizeof(bake_bpace_o) + objKeep(s->ec) + no + O_OF_W(3 * n);
	s->hdr.p_count = 4;
	s->hdr.o_count = 1;
	// K2 <- beltHash(pwd)
	beltHashStart(objEnd(s, void));
	beltHashStepH(pwd, pwd_len, objEnd(s, void));
	beltHashStepG(s->K2, objEnd(s, void));
	// все нормально
	return code;
}